

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xinclude(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing xinclude : 8 of 10 functions ...\n");
  }
  iVar1 = test_xmlXIncludeNewContext();
  iVar2 = test_xmlXIncludeProcess();
  iVar3 = test_xmlXIncludeProcessFlags();
  iVar4 = test_xmlXIncludeProcessFlagsData();
  iVar5 = test_xmlXIncludeProcessNode();
  iVar6 = test_xmlXIncludeProcessTree();
  iVar7 = test_xmlXIncludeProcessTreeFlags();
  iVar8 = test_xmlXIncludeProcessTreeFlagsData();
  iVar9 = test_xmlXIncludeSetFlags();
  uVar10 = iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar2 + iVar1;
  if (uVar10 != 0) {
    printf("Module xinclude: %d errors\n",(ulong)uVar10);
  }
  return uVar10;
}

Assistant:

static int
test_xinclude(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xinclude : 8 of 10 functions ...\n");
    test_ret += test_xmlXIncludeNewContext();
    test_ret += test_xmlXIncludeProcess();
    test_ret += test_xmlXIncludeProcessFlags();
    test_ret += test_xmlXIncludeProcessFlagsData();
    test_ret += test_xmlXIncludeProcessNode();
    test_ret += test_xmlXIncludeProcessTree();
    test_ret += test_xmlXIncludeProcessTreeFlags();
    test_ret += test_xmlXIncludeProcessTreeFlagsData();
    test_ret += test_xmlXIncludeSetFlags();

    if (test_ret != 0)
	printf("Module xinclude: %d errors\n", test_ret);
    return(test_ret);
}